

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5f811d::Db::parseFoldExpr(Db *this)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  Node *pNVar6;
  Node *pNVar7;
  char *pcVar8;
  char *pcVar9;
  Node *pNVar10;
  
  pbVar3 = (byte *)this->First;
  pbVar4 = (byte *)this->Last;
  if (pbVar3 == pbVar4) {
    return (Node *)0x0;
  }
  if (*pbVar3 != 0x66) {
    return (Node *)0x0;
  }
  pbVar1 = pbVar3 + 1;
  this->First = (char *)pbVar1;
  if (pbVar4 == pbVar1) {
    return (Node *)0x0;
  }
  bVar2 = *pbVar1;
  bVar5 = true;
  if (bVar2 < 0x6c) {
    if (bVar2 == 0x4c) goto LAB_001e83d0;
    if (bVar2 != 0x52) {
      return (Node *)0x0;
    }
  }
  else {
    if (bVar2 == 0x6c) goto LAB_001e83d0;
    if (bVar2 != 0x72) {
      return (Node *)0x0;
    }
  }
  bVar5 = false;
LAB_001e83d0:
  pbVar1 = pbVar3 + 2;
  this->First = (char *)pbVar1;
  if (1 < (ulong)((long)pbVar4 - (long)pbVar1)) {
    if (*(short *)pbVar1 == 0x6161) {
      pcVar8 = "&&";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x6e61) {
      pcVar8 = "&";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x4e61) {
      pcVar8 = "&=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x5361) {
      pcVar8 = "=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x6d63) {
      pcVar8 = ",";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x7364) {
      pcVar8 = ".*";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x7664) {
      pcVar8 = "/";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x5664) {
      pcVar8 = "/=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x6f65) {
      pcVar8 = "^";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x4f65) {
      pcVar8 = "^=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x7165) {
      pcVar8 = "==";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x6567) {
      pcVar8 = ">=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x7467) {
      pcVar8 = ">";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x656c) {
      pcVar8 = "<=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x736c) {
      pcVar8 = "<<";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x536c) {
      pcVar8 = "<<=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x746c) {
      pcVar8 = "<";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x696d) {
      pcVar8 = "-";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x496d) {
      pcVar8 = "-=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x6c6d) {
      pcVar8 = "*";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x4c6d) {
      pcVar8 = "*=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x656e) {
      pcVar8 = "!=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x6f6f) {
      pcVar8 = "||";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x726f) {
      pcVar8 = "|";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x526f) {
      pcVar8 = "|=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x6c70) {
      pcVar8 = "+";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x4c70) {
      pcVar8 = "+=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x6d72) {
      pcVar8 = "%";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x4d72) {
      pcVar8 = "%=";
      pcVar9 = "";
    }
    else if (*(short *)pbVar1 == 0x7372) {
      pcVar8 = ">>";
      pcVar9 = "";
    }
    else {
      if (*(short *)pbVar1 != 0x5372) {
        return (Node *)0x0;
      }
      pcVar8 = ">>=";
      pcVar9 = "";
    }
    this->First = (char *)(pbVar3 + 4);
    pNVar6 = parseExpr(this);
    if (pNVar6 != (Node *)0x0) {
      pNVar10 = pNVar6;
      if ((bVar2 == 0x52) || (bVar2 == 0x4c)) {
        pNVar7 = parseExpr(this);
        if (pNVar7 == (Node *)0x0) {
          return (Node *)0x0;
        }
        if (bVar5) {
          pNVar10 = pNVar7;
          pNVar7 = pNVar6;
        }
      }
      else {
        pNVar7 = (Node *)0x0;
      }
      pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x38);
      pNVar6->K = KExpr;
      pNVar6->RHSComponentCache = No;
      pNVar6->ArrayCache = No;
      pNVar6->FunctionCache = No;
      pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00254a40;
      pNVar6[1]._vptr_Node = (_func_int **)pNVar10;
      *(Node **)&pNVar6[1].K = pNVar7;
      pNVar6[2]._vptr_Node = (_func_int **)pcVar8;
      *(char **)&pNVar6[2].K = pcVar9;
      *(bool *)&pNVar6[3]._vptr_Node = bVar5;
      return pNVar6;
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }